

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::EmitTopLevelStatement
          (ByteCodeGenerator *this,ParseNode *stmt,FuncInfo *funcInfo,BOOL fReturnValue)

{
  bool bVar1;
  ParseNodeFnc *this_00;
  ByteCodeWriter *this_01;
  BOOL fReturnValue_local;
  FuncInfo *funcInfo_local;
  ParseNode *stmt_local;
  ByteCodeGenerator *this_local;
  
  if (stmt->nop == knopFncDecl) {
    this_00 = ParseNode::AsParseNodeFnc(stmt);
    bVar1 = ParseNodeFnc::IsDeclaration(this_00);
    if (bVar1) {
      return;
    }
  }
  if ((stmt->nop == knopName) || (stmt->nop == knopDot)) {
    StartStatement(this,stmt);
    this_01 = Writer(this);
    Js::ByteCodeWriter::Empty(this_01,Nop);
    EndStatement(this,stmt);
  }
  ::Emit(stmt,this,funcInfo,fReturnValue,false,true);
  bVar1 = FuncInfo::IsTmpReg(funcInfo,stmt->location);
  if (bVar1) {
    FuncInfo::ReleaseLoc(funcInfo,stmt);
  }
  return;
}

Assistant:

void ByteCodeGenerator::EmitTopLevelStatement(ParseNode *stmt, FuncInfo *funcInfo, BOOL fReturnValue)
{
    if (stmt->nop == knopFncDecl && stmt->AsParseNodeFnc()->IsDeclaration())
    {
        // Function declarations (not function-declaration RHS's) are already fully processed.
        // Skip them here so the temp registers don't get messed up.
        return;
    }

    if (stmt->nop == knopName || stmt->nop == knopDot)
    {
        // Generating span for top level names are mostly useful in debugging mode, because user can debug it even though no side-effect expected.
        // But the name can have runtime error, e.g., foo.bar; // where foo is not defined.
        // At this time we need to throw proper line number and offset. so recording on all modes will be useful.
        StartStatement(stmt);
        Writer()->Empty(Js::OpCode::Nop);
        EndStatement(stmt);
    }

    Emit(stmt, this, funcInfo, fReturnValue, false/*isConstructorCall*/, true/*isTopLevel*/);
    if (funcInfo->IsTmpReg(stmt->location))
    {
        funcInfo->ReleaseLoc(stmt);
    }
}